

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveSimpleObject.cpp
# Opt level: O3

string * __thiscall
PrimitiveSimpleObject::GetTypename_abi_cxx11_
          (string *__return_storage_ptr__,PrimitiveSimpleObject *this)

{
  Type *pTVar1;
  pointer pcVar2;
  
  pTVar1 = this->type_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pTVar1->type_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pTVar1->type_name_)._M_string_length)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveSimpleObject::GetTypename() { return type_->type_name_; }